

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O2

uint32_t pbrt::LeftShift3(uint32_t x)

{
  uint uVar1;
  
  uVar1 = 0x3ff;
  if (x != 0x400) {
    uVar1 = x;
  }
  return ((((uVar1 << 0x10 | uVar1) & 0x30000ff) * 0x101 & 0x300f00f) * 0x11 & 0x30c30c3) * 5 &
         0x9249249;
}

Assistant:

PBRT_CPU_GPU
inline uint32_t LeftShift3(uint32_t x) {
    DCHECK_LE(x, (1u << 10));
    if (x == (1 << 10))
        --x;
    x = (x | (x << 16)) & 0b00000011000000000000000011111111;
    // x = ---- --98 ---- ---- ---- ---- 7654 3210
    x = (x | (x << 8)) & 0b00000011000000001111000000001111;
    // x = ---- --98 ---- ---- 7654 ---- ---- 3210
    x = (x | (x << 4)) & 0b00000011000011000011000011000011;
    // x = ---- --98 ---- 76-- --54 ---- 32-- --10
    x = (x | (x << 2)) & 0b00001001001001001001001001001001;
    // x = ---- 9--8 --7- -6-- 5--4 --3- -2-- 1--0
    return x;
}